

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pedestrian.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_9219d::PedestrianPlugIn::~PedestrianPlugIn(PedestrianPlugIn *this)

{
  ~PedestrianPlugIn(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

void open (void)
        {
            // make the database used to accelerate proximity queries
            cyclePD = -1;
            nextPD ();

            // create the specified number of Pedestrians
            population = 0;
            for (int i = 0; i < gPedestrianStartCount; i++) addPedestrianToCrowd ();

            // initialize camera and selectedVehicle
            Pedestrian& firstPedestrian = **crowd.begin();
            OpenSteerDemo::init3dCamera (firstPedestrian);
            OpenSteerDemo::camera.mode = Camera::cmFixedDistanceOffset;
            OpenSteerDemo::camera.fixedTarget.set (15, 0, 30);
            OpenSteerDemo::camera.fixedPosition.set (15, 70, -70);
        }